

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unload.c
# Opt level: O2

void unload_duh(DUH *duh)

{
  DUH_SIGNAL *__ptr;
  DUH_UNLOAD_SIGDATA p_Var1;
  long lVar2;
  
  if (duh != (DUH *)0x0) {
    if (duh->signal != (DUH_SIGNAL **)0x0) {
      for (lVar2 = 0; lVar2 < duh->n_signals; lVar2 = lVar2 + 1) {
        __ptr = duh->signal[lVar2];
        if (__ptr != (DUH_SIGNAL *)0x0) {
          if (((__ptr->desc != (DUH_SIGTYPE_DESC *)0x0) &&
              (p_Var1 = __ptr->desc->unload_sigdata, p_Var1 != (DUH_UNLOAD_SIGDATA)0x0)) &&
             (__ptr->sigdata != (sigdata_t *)0x0)) {
            (*p_Var1)(__ptr->sigdata);
          }
          free(__ptr);
        }
      }
      free(duh->signal);
    }
    if (duh->tag != (char *(*) [2])0x0) {
      free((*duh->tag)[0]);
      free(duh->tag);
    }
    free(duh);
    return;
  }
  return;
}

Assistant:

void DUMBEXPORT unload_duh(DUH *duh)
{
	int i;

	if (duh) {
		if (duh->signal) {
			for (i = 0; i < duh->n_signals; i++)
				destroy_signal(duh->signal[i]);

			free(duh->signal);
		}

		if (duh->tag) {
			if (duh->tag[0][0])
				free(duh->tag[0][0]);
			free(duh->tag);
		}

		free(duh);
	}
}